

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O0

void validate_tour(Instance *instance,Tour *tour,int32_t min_num_customers_served)

{
  int iVar1;
  _Bool _Var2;
  int iVar3;
  int32_t *piVar4;
  undefined1 *__ptr;
  void *__ptr_00;
  double a;
  int local_64;
  int32_t next_vertex_1;
  int32_t retries;
  int32_t curr_vertex_1;
  int32_t first_vertex;
  int32_t i_2;
  int32_t num_comps;
  _Bool *visited_1;
  int32_t next_vertex;
  int32_t curr_vertex;
  _Bool *visited;
  int32_t num_visited;
  int32_t c_1;
  int32_t i_1;
  int32_t c;
  int32_t i;
  int32_t n;
  int32_t min_num_customers_served_local;
  Tour *tour_local;
  Instance *instance_local;
  
  iVar3 = tour->num_customers + 1;
  if (tour->num_comps != 1) {
    __assert_fail("tour->num_comps == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x4a,"void validate_tour(const Instance *, Tour *, int32_t)");
  }
  piVar4 = tcomp(tour,0);
  if (*piVar4 != 0) {
    __assert_fail("*tcomp(tour, 0) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x51,"void validate_tour(const Instance *, Tour *, int32_t)");
  }
  for (i_1 = 0; i_1 < iVar3; i_1 = i_1 + 1) {
    piVar4 = tcomp(tour,i_1);
    if ((*piVar4 != 0) && (-1 < *piVar4)) {
      __assert_fail("c == 0 || c < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x57,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
  }
  for (num_visited = 0; num_visited < iVar3; num_visited = num_visited + 1) {
    piVar4 = tcomp(tour,num_visited);
    if ((-1 < *piVar4) &&
       ((piVar4 = tsucc(tour,num_visited), *piVar4 < 0 ||
        (piVar4 = tsucc(tour,num_visited), iVar3 <= *piVar4)))) {
      __assert_fail("*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x5f,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
  }
  visited._4_4_ = 0;
  __ptr = (undefined1 *)calloc((long)iVar3,1);
  piVar4 = tcomp(tour,0);
  if (-1 < *piVar4) {
    piVar4 = tsucc(tour,0);
    if ((*piVar4 < 0) || (piVar4 = tcomp(tour,0), *piVar4 < 0)) {
      __assert_fail("*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0x6d,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
    *__ptr = 1;
    visited._4_4_ = 1;
    visited_1._4_4_ = 0;
    while( true ) {
      piVar4 = tsucc(tour,visited_1._4_4_);
      iVar1 = *piVar4;
      if (iVar1 == 0) break;
      if (iVar1 == visited_1._4_4_) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x75,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      if ((iVar1 < 0) || (iVar3 <= iVar1)) {
        __assert_fail("next_vertex >= 0 && next_vertex < n",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x76,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      if ((__ptr[iVar1] & 1) != 0) {
        __assert_fail("visited[next_vertex] == false",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0x77,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      __ptr[iVar1] = 1;
      visited._4_4_ = visited._4_4_ + 1;
      visited_1._4_4_ = iVar1;
    }
  }
  free(__ptr);
  if (visited._4_4_ + -1 < min_num_customers_served) {
    __assert_fail("num_visited - 1 >= (min_num_customers_served)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                  ,0x7f,"void validate_tour(const Instance *, Tour *, int32_t)");
  }
  __ptr_00 = calloc((long)iVar3,1);
  first_vertex = 0;
  curr_vertex_1 = 0;
  do {
    if (iVar3 <= curr_vertex_1) {
      if (first_vertex != tour->num_comps) {
        __assert_fail("num_comps == tour->num_comps",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                      ,0xa3,"void validate_tour(const Instance *, Tour *, int32_t)");
      }
      free(__ptr_00);
      a = tour_demand(instance,tour);
      _Var2 = flte(a,instance->vehicle_cap,1e-05);
      if (_Var2) {
        return;
      }
      __assert_fail("flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                    ,0xaa,"void validate_tour(const Instance *, Tour *, int32_t)");
    }
    if ((*(byte *)((long)__ptr_00 + (long)curr_vertex_1) & 1) == 0) {
      next_vertex_1 = curr_vertex_1;
      *(undefined1 *)((long)__ptr_00 + (long)curr_vertex_1) = 1;
      for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 1) {
        piVar4 = tsucc(tour,next_vertex_1);
        next_vertex_1 = *piVar4;
        if (next_vertex_1 < 0) break;
        *(undefined1 *)((long)__ptr_00 + (long)next_vertex_1) = 1;
        if (next_vertex_1 == curr_vertex_1) {
          first_vertex = first_vertex + 1;
          break;
        }
      }
    }
    curr_vertex_1 = curr_vertex_1 + 1;
  } while( true );
}

Assistant:

void validate_tour(const Instance *instance, Tour *tour,
                   int32_t min_num_customers_served) {
#ifndef NDEBUG
    int32_t n = tour->num_customers + 1;

    //
    // There should be only one subtour
    //
    assert(tour->num_comps == 1);

    //
    // The same subtour should share the same component idx
    //
    {
        // Depot is always part of the tour
        assert(*tcomp(tour, 0) == 0);

        // Check that each vertex is either part of the first and only tour
        // or otherwise it is not visited
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            assert(c == 0 || c < 0);
        }

        // Check that each vertex if is part of a component index it has its
        // succ populated
        for (int32_t i = 0; i < n; i++) {
            int32_t c = *tcomp(tour, i);
            if (c >= 0) {
                assert(*tsucc(tour, i) >= 0 && *tsucc(tour, i) < n);
            }
        }
    }

    //
    // Validate succ array consistency:
    //       - Assert succ is within range
    //       - Vertices cannot be visited twice
    //
    {
        int32_t num_visited = 0;
        bool *visited = calloc(n, sizeof(*visited));
        if (*tcomp(tour, 0) >= 0) {
            assert(*tsucc(tour, 0) >= 0 && *tcomp(tour, 0) >= 0);
            visited[0] = true;
            ++num_visited;

            int32_t curr_vertex = 0;
            int32_t next_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) != 0) {
                assert(next_vertex != curr_vertex);
                assert(next_vertex >= 0 && next_vertex < n);
                assert(visited[next_vertex] == false);
                visited[next_vertex] = true;
                ++num_visited;
                curr_vertex = next_vertex;
            }
        }
        free(visited);

        assert(num_visited - 1 >= (min_num_customers_served));
    }

    //
    // Verify that the number of components that the tour reports
    // is actually consistent with what is encoded in the succ array
    //
    {

        bool *visited = calloc(n, sizeof(*visited));
        int32_t num_comps = 0;
        for (int32_t i = 0; i < n; i++) {
            if (visited[i] == false) {
                int32_t first_vertex = i;
                int32_t curr_vertex = first_vertex;

                visited[first_vertex] = true;

                for (int32_t retries = 0; retries < n; retries++) {
                    int32_t next_vertex = *tsucc(tour, curr_vertex);
                    if (next_vertex < 0) {
                        break;
                    }

                    visited[next_vertex] = true;

                    if (next_vertex == first_vertex) {
                        num_comps++;
                        break;
                    }

                    curr_vertex = next_vertex;
                }
            }
        }

        assert(num_comps == tour->num_comps);
        free(visited);
    }

    //
    // Validate capacity is not exceeded
    //
    assert(flte(tour_demand(instance, tour), instance->vehicle_cap, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(tour);
#endif
}